

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

int vm_builtin_parse_url(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  sxi32 sVar1;
  uint uVar2;
  char *zUri;
  jx9_value *pjVar3;
  jx9_value *pVal;
  undefined8 in_RCX;
  char **zRest;
  anon_union_8_3_18420de5_for_x aVar4;
  int iPort;
  int nLen;
  SyhttpUri sURI;
  int local_c0;
  sxu32 local_bc;
  SyhttpUri local_b8;
  
  if ((((nArg < 1) || (((*apArg)->iFlags & 1) == 0)) ||
      (zUri = jx9_value_to_string(*apArg,(int *)&local_bc), (int)local_bc < 1)) ||
     (sVar1 = VmHttpSplitURI(&local_b8,zUri,local_bc), sVar1 != 0)) {
LAB_0012b509:
    pjVar3 = pCtx->pRet;
    jx9MemObjRelease(pjVar3);
    (pjVar3->x).rVal = 0.0;
    uVar2 = pjVar3->iFlags & 0xfffffe90U | 8;
LAB_0012b527:
    pjVar3->iFlags = uVar2;
    return 0;
  }
  if (nArg == 1) {
    pjVar3 = jx9_context_new_array(pCtx);
    pVal = jx9_context_new_scalar(pCtx);
    zRest = (char **)CONCAT71((int7)((ulong)in_RCX >> 8),pVal != (jx9_value *)0x0);
    if (pjVar3 != (jx9_value *)0x0 && pVal != (jx9_value *)0x0) {
      if (local_b8.sScheme.nByte != 0) {
        jx9_value_string(pVal,local_b8.sScheme.zString,local_b8.sScheme.nByte);
        jx9_array_add_strkey_elem(pjVar3,"scheme",pVal);
      }
      (pVal->sBlob).nByte = 0;
      uVar2 = (pVal->sBlob).nFlags;
      if ((uVar2 & 4) != 0) {
        (pVal->sBlob).pBlob = (void *)0x0;
        (pVal->sBlob).mByte = 0;
        uVar2 = uVar2 & 0xfffffffb;
        (pVal->sBlob).nFlags = uVar2;
      }
      if (local_b8.sHost.nByte != 0) {
        jx9_value_string(pVal,local_b8.sHost.zString,local_b8.sHost.nByte);
        jx9_array_add_strkey_elem(pjVar3,"host",pVal);
        uVar2 = (pVal->sBlob).nFlags;
      }
      (pVal->sBlob).nByte = 0;
      if ((uVar2 & 4) != 0) {
        (pVal->sBlob).pBlob = (void *)0x0;
        (pVal->sBlob).mByte = 0;
        uVar2 = uVar2 & 0xfffffffb;
        (pVal->sBlob).nFlags = uVar2;
      }
      if (local_b8.sPort.nByte != 0) {
        local_c0 = 0;
        SyStrToInt32(local_b8.sPort.zString,local_b8.sPort.nByte,&local_c0,zRest);
        aVar4 = (anon_union_8_3_18420de5_for_x)(long)local_c0;
        jx9MemObjRelease(pVal);
        pVal->x = aVar4;
        pVal->iFlags = pVal->iFlags & 0xfffffe90U | 2;
        jx9_array_add_strkey_elem(pjVar3,"port",pVal);
        uVar2 = (pVal->sBlob).nFlags;
      }
      (pVal->sBlob).nByte = 0;
      if ((uVar2 & 4) != 0) {
        (pVal->sBlob).pBlob = (void *)0x0;
        (pVal->sBlob).mByte = 0;
        uVar2 = uVar2 & 0xfffffffb;
        (pVal->sBlob).nFlags = uVar2;
      }
      if (local_b8.sUser.nByte != 0) {
        jx9_value_string(pVal,local_b8.sUser.zString,local_b8.sUser.nByte);
        jx9_array_add_strkey_elem(pjVar3,"user",pVal);
        uVar2 = (pVal->sBlob).nFlags;
      }
      (pVal->sBlob).nByte = 0;
      if ((uVar2 & 4) != 0) {
        (pVal->sBlob).pBlob = (void *)0x0;
        (pVal->sBlob).mByte = 0;
        uVar2 = uVar2 & 0xfffffffb;
        (pVal->sBlob).nFlags = uVar2;
      }
      if (local_b8.sPass.nByte != 0) {
        jx9_value_string(pVal,local_b8.sPass.zString,local_b8.sPass.nByte);
        jx9_array_add_strkey_elem(pjVar3,"pass",pVal);
        uVar2 = (pVal->sBlob).nFlags;
      }
      (pVal->sBlob).nByte = 0;
      if ((uVar2 & 4) != 0) {
        (pVal->sBlob).pBlob = (void *)0x0;
        (pVal->sBlob).mByte = 0;
        uVar2 = uVar2 & 0xfffffffb;
        (pVal->sBlob).nFlags = uVar2;
      }
      if (local_b8.sPath.nByte != 0) {
        jx9_value_string(pVal,local_b8.sPath.zString,local_b8.sPath.nByte);
        jx9_array_add_strkey_elem(pjVar3,"path",pVal);
        uVar2 = (pVal->sBlob).nFlags;
      }
      (pVal->sBlob).nByte = 0;
      if ((uVar2 & 4) != 0) {
        (pVal->sBlob).pBlob = (void *)0x0;
        (pVal->sBlob).mByte = 0;
        uVar2 = uVar2 & 0xfffffffb;
        (pVal->sBlob).nFlags = uVar2;
      }
      if (local_b8.sQuery.nByte != 0) {
        jx9_value_string(pVal,local_b8.sQuery.zString,local_b8.sQuery.nByte);
        jx9_array_add_strkey_elem(pjVar3,"query",pVal);
        uVar2 = (pVal->sBlob).nFlags;
      }
      (pVal->sBlob).nByte = 0;
      if ((uVar2 & 4) != 0) {
        (pVal->sBlob).pBlob = (void *)0x0;
        (pVal->sBlob).mByte = 0;
        (pVal->sBlob).nFlags = uVar2 & 0xfffffffb;
      }
      if (local_b8.sFragment.nByte != 0) {
        jx9_value_string(pVal,local_b8.sFragment.zString,local_b8.sFragment.nByte);
        jx9_array_add_strkey_elem(pjVar3,"fragment",pVal);
      }
      jx9_result_value(pCtx,pjVar3);
      return 0;
    }
    jx9VmThrowError(pCtx->pVm,&pCtx->pFunc->sName,1,"jx9 engine is running out of memory");
    goto LAB_0012b509;
  }
  pjVar3 = apArg[1];
  jx9MemObjToInteger(pjVar3);
  switch(*(undefined4 *)&pjVar3->x) {
  case 1:
    local_b8.sUser.zString = local_b8.sScheme.zString;
    local_b8.sUser.nByte = local_b8.sScheme.nByte;
    break;
  case 2:
    local_b8.sUser.zString = local_b8.sHost.zString;
    local_b8.sUser.nByte = local_b8.sHost.nByte;
    break;
  case 3:
    if (local_b8.sPort.nByte != 0) {
      local_c0 = 0;
      SyStrToInt32(local_b8.sPort.zString,local_b8.sPort.nByte,&local_c0,
                   (char **)&switchD_0012b822::switchdataD_001414f8);
      aVar4 = (anon_union_8_3_18420de5_for_x)(long)local_c0;
      pjVar3 = pCtx->pRet;
      jx9MemObjRelease(pjVar3);
      pjVar3->x = aVar4;
      uVar2 = pjVar3->iFlags & 0xfffffe90U | 2;
      goto LAB_0012b527;
    }
    goto switchD_0012b822_default;
  case 4:
    break;
  case 5:
    local_b8.sUser.zString = local_b8.sPass.zString;
    local_b8.sUser.nByte = local_b8.sPass.nByte;
    break;
  case 6:
    local_b8.sUser.zString = local_b8.sPath.zString;
    local_b8.sUser.nByte = local_b8.sPath.nByte;
    break;
  case 7:
    local_b8.sUser.zString = local_b8.sQuery.zString;
    local_b8.sUser.nByte = local_b8.sQuery.nByte;
    break;
  case 8:
    local_b8.sUser.zString = local_b8.sFragment.zString;
    local_b8.sUser.nByte = local_b8.sFragment.nByte;
    break;
  default:
    goto switchD_0012b822_default;
  }
  if (local_b8.sUser.nByte == 0) {
switchD_0012b822_default:
    jx9MemObjRelease(pCtx->pRet);
  }
  else {
    jx9_value_string(pCtx->pRet,local_b8.sUser.zString,local_b8.sUser.nByte);
  }
  return 0;
}

Assistant:

static int vm_builtin_parse_url(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	const char *zStr; /* Input string */
	SyString *pComp;  /* Pointer to the URI component */
	SyhttpUri sURI;   /* Parse of the given URI */
	int nLen;
	sxi32 rc;
	if( nArg < 1 || !jx9_value_is_string(apArg[0]) ){
		/* Missing/Invalid arguments, return FALSE */
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Extract the given URI */
	zStr = jx9_value_to_string(apArg[0], &nLen);
	if( nLen < 1 ){
		/* Nothing to process, return FALSE */
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Get a parse */
	rc = VmHttpSplitURI(&sURI, zStr, (sxu32)nLen);
	if( rc != SXRET_OK ){
		/* Malformed input, return FALSE */
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	if( nArg > 1 ){
		int nComponent = jx9_value_to_int(apArg[1]);
		/* Refer to constant.c for constants values */
		switch(nComponent){
		case 1: /* JX9_URL_SCHEME */
			pComp = &sURI.sScheme;
			if( pComp->nByte < 1 ){
				/* No available value, return NULL */
				jx9_result_null(pCtx);
			}else{
				jx9_result_string(pCtx, pComp->zString, (int)pComp->nByte);
			}
			break;
		case 2: /* JX9_URL_HOST */
			pComp = &sURI.sHost;
			if( pComp->nByte < 1 ){
				/* No available value, return NULL */
				jx9_result_null(pCtx);
			}else{
				jx9_result_string(pCtx, pComp->zString, (int)pComp->nByte);
			}
			break;
		case 3: /* JX9_URL_PORT */
			pComp = &sURI.sPort;
			if( pComp->nByte < 1 ){
				/* No available value, return NULL */
				jx9_result_null(pCtx);
			}else{
				int iPort = 0;
				/* Cast the value to integer */
				SyStrToInt32(pComp->zString, pComp->nByte, (void *)&iPort, 0);
				jx9_result_int(pCtx, iPort);
			}
			break;
		case 4: /* JX9_URL_USER */
			pComp = &sURI.sUser;
			if( pComp->nByte < 1 ){
				/* No available value, return NULL */
				jx9_result_null(pCtx);
			}else{
				jx9_result_string(pCtx, pComp->zString, (int)pComp->nByte);
			}
			break;
		case 5: /* JX9_URL_PASS */
			pComp = &sURI.sPass;
			if( pComp->nByte < 1 ){
				/* No available value, return NULL */
				jx9_result_null(pCtx);
			}else{
				jx9_result_string(pCtx, pComp->zString, (int)pComp->nByte);
			}
			break;
		case 7: /* JX9_URL_QUERY */
			pComp = &sURI.sQuery;
			if( pComp->nByte < 1 ){
				/* No available value, return NULL */
				jx9_result_null(pCtx);
			}else{
				jx9_result_string(pCtx, pComp->zString, (int)pComp->nByte);
			}
			break;
		case 8: /* JX9_URL_FRAGMENT */
			pComp = &sURI.sFragment;
			if( pComp->nByte < 1 ){
				/* No available value, return NULL */
				jx9_result_null(pCtx);
			}else{
				jx9_result_string(pCtx, pComp->zString, (int)pComp->nByte);
			}
			break;
		case 6: /*  JX9_URL_PATH */
			pComp = &sURI.sPath;
			if( pComp->nByte < 1 ){
				/* No available value, return NULL */
				jx9_result_null(pCtx);
			}else{
				jx9_result_string(pCtx, pComp->zString, (int)pComp->nByte);
			}
			break;
		default:
			/* No such entry, return NULL */
			jx9_result_null(pCtx);
			break;
		}
	}else{
		jx9_value *pArray, *pValue;
		/* Return an associative array */
		pArray = jx9_context_new_array(pCtx);  /* Empty array */
		pValue = jx9_context_new_scalar(pCtx); /* Array value */
		if( pArray == 0 || pValue == 0 ){
			/* Out of memory */
			jx9_context_throw_error(pCtx, JX9_CTX_ERR, "jx9 engine is running out of memory");
			/* Return false */
			jx9_result_bool(pCtx, 0);
			return JX9_OK;
		}
		/* Fill the array */
		pComp = &sURI.sScheme;
		if( pComp->nByte > 0 ){
			jx9_value_string(pValue, pComp->zString, (int)pComp->nByte);
			jx9_array_add_strkey_elem(pArray, "scheme", pValue); /* Will make it's own copy */
		}
		/* Reset the string cursor */
		jx9_value_reset_string_cursor(pValue);
		pComp = &sURI.sHost;
		if( pComp->nByte > 0 ){
			jx9_value_string(pValue, pComp->zString, (int)pComp->nByte);
			jx9_array_add_strkey_elem(pArray, "host", pValue); /* Will make it's own copy */
		}
		/* Reset the string cursor */
		jx9_value_reset_string_cursor(pValue);
		pComp = &sURI.sPort;
		if( pComp->nByte > 0 ){
			int iPort = 0;/* cc warning */
			/* Convert to integer */
			SyStrToInt32(pComp->zString, pComp->nByte, (void *)&iPort, 0);
			jx9_value_int(pValue, iPort);
			jx9_array_add_strkey_elem(pArray, "port", pValue); /* Will make it's own copy */
		}
		/* Reset the string cursor */
		jx9_value_reset_string_cursor(pValue);
		pComp = &sURI.sUser;
		if( pComp->nByte > 0 ){
			jx9_value_string(pValue, pComp->zString, (int)pComp->nByte);
			jx9_array_add_strkey_elem(pArray, "user", pValue); /* Will make it's own copy */
		}
		/* Reset the string cursor */
		jx9_value_reset_string_cursor(pValue);
		pComp = &sURI.sPass;
		if( pComp->nByte > 0 ){
			jx9_value_string(pValue, pComp->zString, (int)pComp->nByte);
			jx9_array_add_strkey_elem(pArray, "pass", pValue); /* Will make it's own copy */
		}
		/* Reset the string cursor */
		jx9_value_reset_string_cursor(pValue);
		pComp = &sURI.sPath;
		if( pComp->nByte > 0 ){
			jx9_value_string(pValue, pComp->zString, (int)pComp->nByte);
			jx9_array_add_strkey_elem(pArray, "path", pValue); /* Will make it's own copy */
		}
		/* Reset the string cursor */
		jx9_value_reset_string_cursor(pValue);
		pComp = &sURI.sQuery;
		if( pComp->nByte > 0 ){
			jx9_value_string(pValue, pComp->zString, (int)pComp->nByte);
			jx9_array_add_strkey_elem(pArray, "query", pValue); /* Will make it's own copy */
		}
		/* Reset the string cursor */
		jx9_value_reset_string_cursor(pValue);
		pComp = &sURI.sFragment;
		if( pComp->nByte > 0 ){
			jx9_value_string(pValue, pComp->zString, (int)pComp->nByte);
			jx9_array_add_strkey_elem(pArray, "fragment", pValue); /* Will make it's own copy */
		}
		/* Return the created array */
		jx9_result_value(pCtx, pArray);
		/* NOTE:
		 * Don't worry about freeing 'pValue', everything will be released
		 * automatically as soon we return from this function.
		 */
	}
	/* All done */
	return JX9_OK;
}